

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

bool GetRDKObjectInformation(ON_Object *object,ON_wString *xml,int archive_3dm_version)

{
  char *sUTF8;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ON_UserData *pOVar4;
  ON__UINT64 size;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> buffer;
  ON_UserData *objectud;
  wchar_t *sWideChar;
  int len;
  uint error_status;
  int version;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> p;
  ON_SimpleArray<char> s;
  ON_Buffer buf;
  ON_Read3dmBufferArchive archive;
  ON_BinaryArchiveBuffer arc;
  
  if (archive_3dm_version == 0) {
    archive_3dm_version = ON_BinaryArchive::CurrentArchiveVersion();
  }
  ON_wString::SetLength(xml,0);
  pOVar4 = ON_UserData::Cast(object);
  if (pOVar4 == (ON_UserData *)0x0) {
    objectud = ON_Object::FirstUserData(object);
    pOVar4 = (ON_UserData *)0x0;
    while ((objectud != (ON_UserData *)0x0 && (pOVar4 == (ON_UserData *)0x0))) {
      pOVar4 = RDKObjectUserDataHelper(objectud);
      objectud = ON_UserData::Next(objectud);
    }
  }
  else {
    pOVar4 = RDKObjectUserDataHelper(pOVar4);
  }
  if (pOVar4 == (ON_UserData *)0x0) {
    return false;
  }
  ON_Buffer::ON_Buffer(&buf);
  ON_BinaryArchiveBuffer::ON_BinaryArchiveBuffer(&arc,write,&buf);
  (*(pOVar4->super_ON_Object)._vptr_ON_Object[10])(pOVar4);
  size = ON_Buffer::Size(&buf);
  buffer.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)operator_new__(size);
  p._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       buffer.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  ON_Buffer::SeekFromStart(&buf,0);
  ON_Buffer::Read(&buf,size,
                  (void *)buffer.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  uVar2 = ON::Version();
  ON_Read3dmBufferArchive::ON_Read3dmBufferArchive
            (&archive,size,
             (void *)buffer.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,false,
             archive_3dm_version,uVar2);
  version = 0;
  bVar1 = ON_BinaryArchive::ReadInt(&archive.super_ON_BinaryArchive,&version);
  if (bVar1) {
    if (version == 2) {
      len = 0;
      bVar1 = ON_BinaryArchive::ReadInt(&archive.super_ON_BinaryArchive,&len);
      if ((bVar1) && ((ulong)(uint)len + 4 <= size && 0 < len)) {
        s._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008216b0;
        s.m_a = (char *)0x0;
        s.m_count = 0;
        s.m_capacity = 0;
        ON_SimpleArray<char>::Reserve(&s,(ulong)(uint)len + 1);
        sUTF8 = s.m_a;
        if ((-2 < (long)len) && (len < s.m_capacity)) {
          s.m_count = len + 1;
        }
        s.m_a[len] = '\0';
        if (((s.m_a != (char *)0x0) &&
            (bVar1 = ON_BinaryArchive::ReadChar(&archive.super_ON_BinaryArchive,(long)len,s.m_a),
            bVar1)) && (*sUTF8 != '\0')) {
          error_status = 0;
          uVar2 = ON_ConvertUTF8ToWideChar
                            (0,sUTF8,-1,(wchar_t *)0x0,0,&error_status,0,0,(char **)0x0);
          if (((int)uVar2 < 1) || (error_status != 0)) {
            ON_wString::SetLength(xml,0);
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                       ,0x1666,"","RDK xml object information is not a valid UTF-8 string.");
          }
          else {
            ON_wString::SetLength(xml,(ulong)uVar2 + 2);
            sWideChar = ON_wString::Array(xml);
            ON_ConvertUTF8ToWideChar(0,sUTF8,-1,sWideChar,uVar2 + 1,&error_status,0,0,(char **)0x0);
            ON_wString::SetLength(xml,(ulong)uVar2);
          }
          ON_SimpleArray<char>::~ON_SimpleArray(&s);
          goto LAB_0048bc82;
        }
        ON_SimpleArray<char>::~ON_SimpleArray(&s);
      }
    }
    else if ((version != 1) ||
            (bVar1 = ON_BinaryArchive::ReadString(&archive.super_ON_BinaryArchive,xml), bVar1)) {
LAB_0048bc82:
      iVar3 = ON_wString::Length(xml);
      bVar1 = 0 < iVar3;
      goto LAB_0048be1d;
    }
  }
  bVar1 = false;
LAB_0048be1d:
  ON_Read3dmBufferArchive::~ON_Read3dmBufferArchive(&archive);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&p);
  ON_BinaryArchiveBuffer::~ON_BinaryArchiveBuffer(&arc);
  ON_Buffer::~ON_Buffer(&buf);
  return bVar1;
}

Assistant:

static bool GetRDKObjectInformation(const ON_Object& object, ON_wString& xml, int archive_3dm_version)
{
  if (0 == archive_3dm_version)
    archive_3dm_version = ON_BinaryArchive::CurrentArchiveVersion();

  xml.SetLength(0);

  const ON_UserData* rdk_ud = nullptr;
  const auto* ud = ON_UserData::Cast(&object);
  if (nullptr != ud)
  {
    rdk_ud = RDKObjectUserDataHelper(ud);
  }
  else
  {
    for (ud = object.FirstUserData(); (nullptr != ud) && (nullptr == rdk_ud); ud = ud->Next())
    {
      rdk_ud = RDKObjectUserDataHelper(ud);
    }
  }

  if (nullptr == rdk_ud)
    return false;

  ON_Buffer buf;
  ON_BinaryArchiveBuffer arc(ON::archive_mode::write, &buf);
  rdk_ud->Write(arc);

  const auto sizeof_buffer = buf.Size();

  auto p = std::unique_ptr<ON__UINT8[]>(new ON__UINT8[size_t(sizeof_buffer)]);
  ON__UINT8* buffer = p.get();
  buf.SeekFromStart(0);
  buf.Read(sizeof_buffer, buffer);

  const unsigned int archive_opennurbs_version_number = ON::Version();
  ON_Read3dmBufferArchive archive(size_t(sizeof_buffer), buffer, false, archive_3dm_version, archive_opennurbs_version_number);

  int version = 0;
  if (!archive.ReadInt(&version))
    return false;

  if (1 == version)
  {
    // Version 1 was a UTF-16 string.
    if (!archive.ReadString(xml))
      return false;
  }
  else
  if (2 == version)
  {
    // Version 2 is a UTF-8 string.
    int len = 0;
    if (!archive.ReadInt(&len))
      return false;

    if (len <= 0)
      return false;

    if (size_t(len + 4) > sizeof_buffer) // JohnC asks: What does the 4 signify?
      return false;

    ON_SimpleArray<char> s;
    s.Reserve(size_t(len) + 1);
    s.SetCount(len + 1);
    s[len] = 0;

    char* sArray = s.Array();
    if (nullptr == sArray)
      return false;

    if (!archive.ReadChar(len, sArray))
      return false;

    if (0 == sArray[0])
      return false;

    unsigned int error_status = 0;
    const int num_chars = ON_ConvertUTF8ToWideChar(false, sArray, -1, 0, 0, &error_status, 0, 0, 0);
    if ((num_chars > 0) && (0 == error_status))
    {
      xml.SetLength(size_t(num_chars) + 2);
      ON_ConvertUTF8ToWideChar(false, sArray, -1, xml.Array(), num_chars + 1, &error_status, 0, 0, 0);
      xml.SetLength(num_chars);
    }
    else
    {
      xml.SetLength(0);
      ON_ERROR("RDK xml object information is not a valid UTF-8 string.");
    }
  }

  return xml.Length() > 0;
}